

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int UTF8ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  undefined4 local_40;
  undefined4 local_3c;
  int ret;
  int len;
  void *vctxt_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  if (in == (uchar *)0x0) {
    *inlen = 0;
    *outlen = 0;
    out_local._4_4_ = 0;
  }
  else {
    if (*outlen < *inlen) {
      local_3c = *outlen;
      local_40 = -3;
    }
    else {
      local_40 = *inlen;
      local_3c = local_40;
    }
    memcpy(out,in,(long)local_3c);
    *outlen = local_3c;
    *inlen = local_3c;
    out_local._4_4_ = local_40;
  }
  return out_local._4_4_;
}

Assistant:

static int
UTF8ToUTF8(unsigned char* out, int *outlen,
           const unsigned char* in, int *inlen,
           void *vctxt ATTRIBUTE_UNUSED) {
    int len;
    int ret;

    if (in == NULL) {
        *inlen = 0;
        *outlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    if (*outlen < *inlen) {
	len = *outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
	len = *inlen;
        ret = len;
    }

    memcpy(out, in, len);

    *outlen = len;
    *inlen = len;
    return(ret);
}